

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinSerializer<std::vector<char,_std::allocator<char>_>,_void>::
     serialize<OutputStream>(vector<char,_std::allocator<char>_> *s,OutputStream *ostream)

{
  int iVar1;
  int local_1c;
  
  iVar1 = (int)(s->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
               _M_finish -
          (int)(s->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
               _M_start;
  local_1c = iVar1;
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_1c);
  if (iVar1 != 0) {
    std::ostream::write((char *)(ostream->stream + 0x10),
                        (long)(s->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }